

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_get_address(ENetSocket socket,ENetAddress *address)

{
  uint16_t uVar1;
  int iVar2;
  sockaddr_in6 *sin_1;
  sockaddr_in *sin;
  undefined1 local_98 [4];
  socklen_t saLength;
  sockaddr_storage ss;
  ENetAddress *address_local;
  ENetSocket socket_local;
  
  sin._4_4_ = 0x80;
  ss.__ss_align = (unsigned_long)address;
  iVar2 = getsockname(socket,(sockaddr *)local_98,(socklen_t *)((long)&sin + 4));
  if (iVar2 == -1) {
    address_local._4_4_ = -1;
  }
  else {
    if (local_98._0_2_ == 2) {
      memset((void *)ss.__ss_align,0,10);
      *(undefined2 *)(ss.__ss_align + 10) = 0xffff;
      *(socklen_t *)(ss.__ss_align + 0xc) = saLength;
      uVar1 = ntohs(local_98._2_2_);
      *(uint16_t *)(ss.__ss_align + 0x10) = uVar1;
    }
    else if (local_98._0_2_ == 10) {
      *(undefined8 *)ss.__ss_align = ss._0_8_;
      *(undefined8 *)(ss.__ss_align + 8) = ss.__ss_padding._6_8_;
      uVar1 = ntohs(local_98._2_2_);
      *(uint16_t *)(ss.__ss_align + 0x10) = uVar1;
    }
    address_local._4_4_ = 0;
  }
  return address_local._4_4_;
}

Assistant:

int enet_socket_get_address(ENetSocket socket, ENetAddress* address) {
	struct sockaddr_storage ss;
	socklen_t saLength = sizeof(ss);

	if (getsockname(socket, (struct sockaddr*)&ss, &saLength) == -1) {
		ENET_LOG_ERROR("Getsockname() error.");
		return -1;
	}

	if (ss.ss_family == AF_INET) {
		struct sockaddr_in* sin = (struct sockaddr_in*)&ss;

		memset(address, 0, sizeof(address->ipv4.zeros));

		address->ipv4.ffff = 0xFFFF;
		address->ipv4.ip = sin->sin_addr;
		address->port = ENET_NET_TO_HOST_16(sin->sin_port);
	}
	else if (ss.ss_family == AF_INET6) {
		struct sockaddr_in6* sin = (struct sockaddr_in6*)&ss;

		address->ipv6 = sin->sin6_addr;
		address->port = ENET_NET_TO_HOST_16(sin->sin6_port);
	}

	return 0;
}